

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O1

int CfdIsFindPsbtRecord(void *handle,void *psbt_handle,int type,uint32_t index,char *key)

{
  pointer pcVar1;
  bool bVar2;
  CfdException *pCVar3;
  ByteData key_data;
  allocator local_6d;
  int local_6c;
  undefined1 local_68 [32];
  ByteData local_48;
  
  local_6c = type;
  cfd::Initialize();
  pcVar1 = local_68 + 0x10;
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_68);
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_);
  }
  bVar2 = cfd::capi::IsEmptyString(key);
  if (!bVar2) {
    if (*(long *)((long)psbt_handle + 0x18) == 0) {
      local_68._0_8_ = "cfdcapi_psbt.cpp";
      local_68._8_4_ = 0x931;
      local_68._16_8_ = "CfdIsFindPsbtRecord";
      cfd::core::logger::log<>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"psbt is null.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_68._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"Failed to handle statement. psbt is null.","");
      cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_68);
      __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::__cxx11::string::string((string *)local_68,key,&local_6d);
    cfd::core::ByteData::ByteData(&local_48,(string *)local_68);
    if ((pointer)local_68._0_8_ != pcVar1) {
      operator_delete((void *)local_68._0_8_);
    }
    if (local_6c == 1) {
      bVar2 = cfd::core::Psbt::IsFindGlobalRecord(*(Psbt **)((long)psbt_handle + 0x18),&local_48);
    }
    else if (local_6c == 2) {
      bVar2 = cfd::core::Psbt::IsFindTxInRecord
                        (*(Psbt **)((long)psbt_handle + 0x18),index,&local_48);
    }
    else {
      if (local_6c != 3) {
        local_68._0_8_ = "cfdcapi_psbt.cpp";
        local_68._8_4_ = 0x944;
        local_68._16_8_ = "CfdIsFindPsbtRecord";
        cfd::core::logger::log<int&>
                  ((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"type is invalid: {}",&local_6c
                  );
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        local_68._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,"Failed to parameter. type is invalid.","");
        cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_68);
        __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      bVar2 = cfd::core::Psbt::IsFindTxOutRecord
                        (*(Psbt **)((long)psbt_handle + 0x18),index,&local_48);
    }
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return (uint)(bVar2 ^ 1) << 3;
  }
  local_68._0_8_ = "cfdcapi_psbt.cpp";
  local_68._8_4_ = 0x92b;
  local_68._16_8_ = "CfdIsFindPsbtRecord";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"key is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"Failed to parameter. key is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_68);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdIsFindPsbtRecord(
    void* handle, void* psbt_handle, int type, uint32_t index,
    const char* key) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(key)) {
      warn(CFD_LOG_SOURCE, "key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    ByteData key_data(key);
    bool is_find = true;
    switch (type) {
      case kCfdPsbtRecordTypeGlobal:
        is_find = psbt_obj->psbt->IsFindGlobalRecord(key_data);
        break;
      case kCfdPsbtRecordTypeInput:
        is_find = psbt_obj->psbt->IsFindTxInRecord(index, key_data);
        break;
      case kCfdPsbtRecordTypeOutput:
        is_find = psbt_obj->psbt->IsFindTxOutRecord(index, key_data);
        break;
      default:
        warn(CFD_LOG_SOURCE, "type is invalid: {}", type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. type is invalid.");
    }

    if (!is_find) return CfdErrorCode::kCfdNotFoundError;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}